

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O3

Integer pnga_sprs_array_dnssprs_multiply(Integer g_a,Integer s_b,Integer trans)

{
  double *pdVar1;
  size_t __size;
  int *piVar2;
  long *plVar3;
  float fVar4;
  float fVar5;
  double dVar6;
  undefined8 uVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  Integer IVar15;
  int iVar16;
  long lVar17;
  Integer IVar18;
  C_Integer *pCVar19;
  Integer g_a_00;
  Integer *mapc;
  void *pvVar20;
  long lVar21;
  long lVar22;
  logical lVar23;
  Integer IVar24;
  long lVar25;
  long lVar26;
  Integer IVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  double *pdVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  ulong uVar35;
  Integer IVar36;
  long lVar37;
  bool bVar38;
  float fVar39;
  float fVar40;
  long local_200;
  long local_1e8;
  long local_1d8;
  long local_1c8;
  long local_1b8;
  long local_1b0;
  long local_1a8;
  long local_1a0;
  Integer jlo_b;
  void *data_c;
  long local_180;
  long local_178;
  long local_170;
  long local_168;
  Integer local_160;
  long local_158;
  Integer local_150;
  long local_148;
  long local_140;
  long local_138;
  int local_12c;
  Integer tlo_c [2];
  long local_118;
  long local_110;
  Integer hi_c [2];
  Integer lo_c [2];
  void *val_b;
  Integer ihi_b;
  Integer ilo_b;
  void *jptr_b;
  void *iptr_b;
  Integer ld_a [2];
  Integer jhi_b;
  long local_58;
  Integer local_50;
  long local_48;
  long local_40;
  
  lVar28 = g_a + 1000;
  lVar17 = s_b + 1000;
  local_160 = pnga_pgroup_nnodes(SPA[lVar17].grp);
  IVar18 = pnga_pgroup_nodeid(SPA[lVar17].grp);
  bVar38 = _ga_sync_begin != 0;
  local_12c = _ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (bVar38) {
    pnga_pgroup_sync(SPA[lVar17].grp);
  }
  if (SPA[lVar17].type != (long)GA[lVar28].type) {
    pnga_error("(ga_sprs_array_dnssprs_multiply) types of sparse matrices A and B must match",0);
  }
  local_150 = SPA[lVar17].type;
  if (SPA[lVar17].grp != (long)GA[lVar28].p_handle) {
    pnga_error("(ga_sprs_array_dnssprs_multiply) matrices A and B must be on the same group",0);
  }
  if ((long)GA[lVar28].ndim != 2) {
    pnga_error("(ga_sprs_array_dnssprs_multiply) matrix A must be of dimension 2",
               (long)GA[lVar28].ndim);
  }
  if (trans == 0) {
    if (GA[lVar28].dims[1] != SPA[lVar17].jdim) {
      pnga_error("(ga_sprs_array_dnssprs_multiply) column dimension of A must match row dimension of B"
                 ,0);
    }
    pCVar19 = GA[lVar28].dims;
  }
  else {
    if (GA[lVar28].dims[0] != SPA[lVar17].jdim) {
      pnga_error("(ga_sprs_array_dnssprs_multiply) column dimension of A must match row dimension of B"
                 ,0);
    }
    pCVar19 = GA[lVar28].dims + 1;
  }
  lVar28 = *pCVar19;
  lVar8 = SPA[lVar17].jdim;
  local_148 = lVar17 * 200;
  g_a_00 = pnga_create_handle();
  local_40 = lVar28;
  local_48 = lVar8;
  if (trans == 0) {
    local_40 = lVar8;
    local_48 = lVar28;
  }
  pnga_set_data(g_a_00,2,&local_48,local_150);
  IVar36 = local_160;
  __size = local_160 * 8;
  mapc = (Integer *)malloc(local_160 * 8 + 8);
  pvVar20 = malloc(__size);
  lVar17 = (lVar28 * IVar18) / IVar36;
  lVar30 = IVar36 * lVar17;
  lVar26 = (lVar17 + -1) * IVar36;
  do {
    lVar21 = lVar30 / lVar28;
    lVar17 = lVar17 + 1;
    lVar30 = lVar30 + IVar36;
    lVar26 = lVar26 + IVar36;
  } while (lVar21 < IVar18);
  do {
    lVar30 = lVar26 / lVar28;
    lVar17 = lVar17 + -1;
    lVar26 = lVar26 - IVar36;
  } while (IVar18 < lVar30);
  uVar35 = (ulong)(lVar30 != IVar18);
  lVar26 = lVar28;
  if (IVar18 < IVar36 + -1) {
    lVar26 = (lVar28 * (IVar18 + 1)) / IVar36;
    lVar21 = IVar36 * lVar26;
    lVar30 = (lVar26 + -1) * IVar36;
    do {
      lVar22 = lVar21 / lVar28;
      lVar26 = lVar26 + 1;
      lVar21 = lVar21 + IVar36;
      lVar30 = lVar30 + IVar36;
    } while (lVar22 <= IVar18);
    do {
      lVar21 = lVar30 / lVar28;
      lVar26 = lVar26 + -1;
      lVar30 = lVar30 - IVar36;
    } while (IVar18 + 1 < lVar21);
  }
  if (0 < IVar36) {
    memset(pvVar20,0,__size);
  }
  IVar27 = local_160;
  *(ulong *)((long)pvVar20 + IVar18 * 8) = (lVar26 - uVar35) - lVar17;
  pnga_pgroup_gop(*(Integer *)((long)&SPA->grp + local_148),0x3ea,pvVar20,local_160,"+");
  *mapc = 1;
  if (trans == 0) {
    if (1 < IVar27) {
      lVar28 = 1;
      lVar30 = 0;
      do {
        lVar28 = lVar28 + *(long *)((long)pvVar20 + lVar30 * 8);
        mapc[lVar30 + 1] = lVar28;
        lVar30 = lVar30 + 1;
      } while (IVar36 + -1 != lVar30);
    }
    mapc[local_160] = 1;
    IVar27 = 1;
    local_58 = local_160;
    lVar28 = local_160;
  }
  else {
    mapc[1] = 1;
    local_58 = 1;
    lVar28 = IVar27;
    if (1 < IVar27) {
      lVar30 = 1;
      lVar21 = 1;
      do {
        lVar30 = lVar30 + *(long *)((long)pvVar20 + lVar21 * 8 + -8);
        mapc[lVar21 + 1] = lVar30;
        lVar21 = lVar21 + 1;
      } while (IVar27 != lVar21);
    }
  }
  local_50 = IVar27;
  pnga_set_irreg_distr(g_a_00,mapc,&local_58);
  lVar30 = local_148;
  pnga_set_pgroup(g_a_00,*(Integer *)((long)&SPA->grp + local_148));
  lVar23 = pnga_allocate(g_a_00);
  if (lVar23 == 0) {
    pnga_error("(ga_sprs_array_sprsdns_multiply) could not allocate product array C",0);
  }
  pnga_zero(g_a_00);
  if (0 < lVar28) {
    IVar18 = 0;
    do {
      hi_c[0] = lVar26;
      lo_c[0] = uVar35 + lVar17 + 1;
      pnga_sprs_array_row_distribution(s_b,IVar18,lo_c + 1,hi_c + 1);
      lo_c[1] = lo_c[1] + 1;
      hi_c[1] = hi_c[1] + 1;
      if (trans == 0) {
        tlo_c[0] = lo_c[0];
        local_118 = hi_c[0];
        local_110 = hi_c[1];
        tlo_c[1] = lo_c[1];
      }
      else {
        tlo_c[1] = lo_c[0];
        local_110 = hi_c[0];
        tlo_c[0] = lo_c[1];
        local_118 = hi_c[1];
      }
      local_138 = lo_c[0];
      local_140 = hi_c[0];
      IVar36 = 0;
      do {
        if (trans == 0) {
          local_178 = (local_118 - tlo_c[0]) + 1;
          local_170 = lVar8;
        }
        else {
          local_170 = (local_110 - tlo_c[1]) + 1;
          local_178 = lVar8;
        }
        pnga_access_ptr(g_a_00,tlo_c,&local_118,&data_c,&local_178);
        lVar23 = pnga_sprs_array_get_block
                           (s_b,IVar36,IVar18,&iptr_b,&jptr_b,&val_b,&ilo_b,&ihi_b,&jlo_b,&jhi_b);
        IVar15 = ilo_b;
        IVar27 = ihi_b;
        if (lVar23 != 0) {
          local_1a8 = ilo_b;
          local_1a0 = local_138;
          local_1b8 = ihi_b;
          local_1b0 = local_140;
          if (trans == 0) {
            local_1a8 = local_138;
            local_1a0 = ilo_b;
            local_1b8 = local_140;
            local_1b0 = ihi_b;
          }
          lVar28 = (local_1b8 - local_1a8) + 1;
          lVar21 = (local_1b0 - local_1a0) + 1;
          pvVar20 = malloc(lVar21 * lVar28 * *(long *)((long)&SPA->size + lVar30));
          ld_a[0] = lVar28;
          ld_a[1] = lVar21;
          pnga_get(g_a,&local_1a8,&local_1b8,pvVar20,ld_a);
          if (*(long *)((long)&SPA->idx_size + lVar30) == 4) {
            switch(local_150) {
            case 0x3e9:
              lVar28 = local_1b8;
              lVar30 = local_1a8;
              if (trans != 0) {
                lVar28 = local_1b0;
                lVar30 = local_1a0;
              }
              if (lVar30 <= lVar28) {
                lVar21 = (local_1b8 - local_1a8) + 1;
                local_200 = lVar30;
                do {
                  if (IVar15 <= IVar27) {
                    lVar22 = local_200 - lVar30;
                    IVar24 = IVar15;
                    do {
                      lVar29 = IVar24 - IVar15;
                      iVar16 = *(int *)((long)iptr_b + lVar29 * 4 + 4) -
                               *(int *)((long)iptr_b + lVar29 * 4);
                      if (trans == 0) {
                        if (0 < iVar16) {
                          lVar32 = 0;
                          do {
                            lVar33 = *(int *)((long)iptr_b + lVar29 * 4) + lVar32;
                            piVar2 = (int *)((long)data_c +
                                            ((*(int *)((long)jptr_b + lVar33 * 4) - jlo_b) + 1) *
                                            local_178 * 4 + lVar22 * 4);
                            *piVar2 = *piVar2 + *(int *)((long)val_b + lVar33 * 4) *
                                                *(int *)((long)pvVar20 +
                                                        lVar29 * lVar21 * 4 + lVar22 * 4);
                            lVar32 = lVar32 + 1;
                          } while (iVar16 != lVar32);
                        }
                      }
                      else if (0 < iVar16) {
                        lVar32 = 0;
                        do {
                          lVar33 = *(int *)((long)iptr_b + lVar29 * 4) + lVar32;
                          piVar2 = (int *)((long)data_c +
                                          (*(int *)((long)jptr_b + lVar33 * 4) - jlo_b) * 4 +
                                          local_178 * lVar22 * 4 + 4);
                          *piVar2 = *piVar2 + *(int *)((long)val_b + lVar33 * 4) *
                                              *(int *)((long)pvVar20 +
                                                      lVar29 * 4 + lVar22 * lVar21 * 4);
                          lVar32 = lVar32 + 1;
                        } while (iVar16 != lVar32);
                      }
                      bVar38 = IVar24 != IVar27;
                      IVar24 = IVar24 + 1;
                    } while (bVar38);
                  }
                  bVar38 = local_200 != lVar28;
                  local_200 = local_200 + 1;
                } while (bVar38);
              }
              break;
            case 0x3ea:
              lVar28 = local_1b8;
              local_180 = local_1a8;
              if (trans != 0) {
                lVar28 = local_1b0;
                local_180 = local_1a0;
              }
              if (local_180 <= lVar28) {
                lVar30 = (local_1b8 - local_1a8) + 1;
                local_1d8 = local_180;
                do {
                  if (IVar15 <= IVar27) {
                    lVar21 = local_1d8 - local_180;
                    IVar24 = IVar15;
                    do {
                      lVar22 = IVar24 - IVar15;
                      iVar16 = *(int *)((long)iptr_b + lVar22 * 4);
                      lVar29 = (long)iVar16;
                      iVar16 = *(int *)((long)iptr_b + lVar22 * 4 + 4) - iVar16;
                      if (trans == 0) {
                        if (0 < iVar16) {
                          lVar32 = 0;
                          do {
                            plVar3 = (long *)((long)data_c +
                                             ((*(int *)((long)jptr_b + lVar32 * 4 + lVar29 * 4) -
                                              jlo_b) + 1) * local_178 * 8 + lVar21 * 8);
                            *plVar3 = *plVar3 + *(long *)((long)val_b + lVar32 * 8 + lVar29 * 8) *
                                                *(long *)((long)pvVar20 +
                                                         lVar22 * lVar30 * 8 + lVar21 * 8);
                            lVar32 = lVar32 + 1;
                          } while (iVar16 != lVar32);
                        }
                      }
                      else if (0 < iVar16) {
                        lVar32 = 0;
                        do {
                          plVar3 = (long *)((long)data_c +
                                           local_178 * lVar21 * 8 +
                                           (*(int *)((long)jptr_b + lVar32 * 4 + lVar29 * 4) - jlo_b
                                           ) * 8 + 8);
                          *plVar3 = *plVar3 + *(long *)((long)val_b + lVar32 * 8 + lVar29 * 8) *
                                              *(long *)((long)pvVar20 +
                                                       lVar22 * 8 + lVar21 * lVar30 * 8);
                          lVar32 = lVar32 + 1;
                        } while (iVar16 != lVar32);
                      }
                      bVar38 = IVar24 != IVar27;
                      IVar24 = IVar24 + 1;
                    } while (bVar38);
                  }
                  bVar38 = local_1d8 != lVar28;
                  local_1d8 = local_1d8 + 1;
                } while (bVar38);
              }
              break;
            case 0x3eb:
              lVar28 = local_1b8;
              lVar30 = local_1a8;
              if (trans != 0) {
                lVar28 = local_1b0;
                lVar30 = local_1a0;
              }
              if (lVar30 <= lVar28) {
                lVar21 = (local_1b8 - local_1a8) + 1;
                local_200 = lVar30;
                do {
                  if (IVar15 <= IVar27) {
                    lVar29 = local_200 - lVar30;
                    lVar22 = local_178 * lVar29 * 4 + 4;
                    IVar24 = IVar15;
                    do {
                      lVar32 = IVar24 - IVar15;
                      iVar16 = *(int *)((long)iptr_b + lVar32 * 4);
                      lVar33 = (long)iVar16;
                      iVar16 = *(int *)((long)iptr_b + lVar32 * 4 + 4) - iVar16;
                      if (trans == 0) {
                        if (0 < iVar16) {
                          lVar34 = 0;
                          do {
                            lVar37 = ((*(int *)((long)jptr_b + lVar34 * 4 + lVar33 * 4) - jlo_b) + 1
                                     ) * local_178;
                            *(float *)((long)data_c + lVar37 * 4 + lVar29 * 4) =
                                 *(float *)((long)pvVar20 + lVar32 * lVar21 * 4 + lVar29 * 4) *
                                 *(float *)((long)val_b + lVar34 * 4 + lVar33 * 4) +
                                 *(float *)((long)data_c + lVar37 * 4 + lVar29 * 4);
                            lVar34 = lVar34 + 1;
                          } while (iVar16 != lVar34);
                        }
                      }
                      else if (0 < iVar16) {
                        lVar34 = 0;
                        do {
                          lVar37 = *(int *)((long)jptr_b + lVar34 * 4 + lVar33 * 4) - jlo_b;
                          *(float *)((long)data_c + lVar37 * 4 + lVar22) =
                               *(float *)((long)pvVar20 + lVar32 * 4 + lVar29 * lVar21 * 4) *
                               *(float *)((long)val_b + lVar34 * 4 + lVar33 * 4) +
                               *(float *)((long)data_c + lVar37 * 4 + lVar22);
                          lVar34 = lVar34 + 1;
                        } while (iVar16 != lVar34);
                      }
                      bVar38 = IVar24 != IVar27;
                      IVar24 = IVar24 + 1;
                    } while (bVar38);
                  }
                  bVar38 = local_200 != lVar28;
                  local_200 = local_200 + 1;
                } while (bVar38);
              }
              break;
            case 0x3ec:
              lVar28 = local_1b8;
              lVar30 = local_1a8;
              if (trans != 0) {
                lVar28 = local_1b0;
                lVar30 = local_1a0;
              }
              if (lVar30 <= lVar28) {
                lVar21 = (local_1b8 - local_1a8) + 1;
                local_200 = lVar30;
                do {
                  if (IVar15 <= IVar27) {
                    lVar29 = local_200 - lVar30;
                    lVar22 = local_178 * lVar29 * 8 + 8;
                    IVar24 = IVar15;
                    do {
                      lVar32 = IVar24 - IVar15;
                      iVar16 = *(int *)((long)iptr_b + lVar32 * 4);
                      lVar33 = (long)iVar16;
                      iVar16 = *(int *)((long)iptr_b + lVar32 * 4 + 4) - iVar16;
                      if (trans == 0) {
                        if (0 < iVar16) {
                          lVar34 = 0;
                          do {
                            lVar37 = ((*(int *)((long)jptr_b + lVar34 * 4 + lVar33 * 4) - jlo_b) + 1
                                     ) * local_178;
                            *(double *)((long)data_c + lVar37 * 8 + lVar29 * 8) =
                                 *(double *)((long)pvVar20 + lVar32 * lVar21 * 8 + lVar29 * 8) *
                                 *(double *)((long)val_b + lVar34 * 8 + lVar33 * 8) +
                                 *(double *)((long)data_c + lVar37 * 8 + lVar29 * 8);
                            lVar34 = lVar34 + 1;
                          } while (iVar16 != lVar34);
                        }
                      }
                      else if (0 < iVar16) {
                        lVar34 = 0;
                        do {
                          lVar37 = *(int *)((long)jptr_b + lVar34 * 4 + lVar33 * 4) - jlo_b;
                          *(double *)((long)data_c + lVar37 * 8 + lVar22) =
                               *(double *)((long)pvVar20 + lVar32 * 8 + lVar29 * lVar21 * 8) *
                               *(double *)((long)val_b + lVar34 * 8 + lVar33 * 8) +
                               *(double *)((long)data_c + lVar37 * 8 + lVar22);
                          lVar34 = lVar34 + 1;
                        } while (iVar16 != lVar34);
                      }
                      bVar38 = IVar24 != IVar27;
                      IVar24 = IVar24 + 1;
                    } while (bVar38);
                  }
                  bVar38 = local_200 != lVar28;
                  local_200 = local_200 + 1;
                } while (bVar38);
              }
              break;
            case 0x3ee:
              lVar28 = local_1b8;
              local_168 = local_1a8;
              if (trans != 0) {
                lVar28 = local_1b0;
                local_168 = local_1a0;
              }
              if (local_168 <= lVar28) {
                local_158 = (local_1b8 - local_1a8) * 2 + 2;
                lVar30 = (local_1b8 - local_1a8) + 1;
                local_1c8 = local_168;
                do {
                  if (IVar15 <= IVar27) {
                    lVar21 = local_1c8 - local_168;
                    IVar24 = IVar15;
                    do {
                      lVar29 = IVar24 - IVar15;
                      iVar16 = *(int *)((long)iptr_b + lVar29 * 4);
                      lVar22 = (long)iVar16;
                      iVar16 = *(int *)((long)iptr_b + lVar29 * 4 + 4) - iVar16;
                      if (trans == 0) {
                        if (0 < iVar16) {
                          lVar32 = 0;
                          do {
                            fVar4 = *(float *)((long)pvVar20 +
                                              (local_158 * lVar21 * lVar29 | 1U) * 4);
                            lVar33 = ((*(int *)((long)jptr_b + lVar32 * 4 + lVar22 * 4) - jlo_b) + 1
                                     ) * local_178 + lVar21;
                            fVar5 = *(float *)((long)val_b + lVar32 * 8 + lVar22 * 8);
                            fVar39 = *(float *)((long)val_b + lVar32 * 8 + lVar22 * 8 + 4);
                            fVar40 = *(float *)((long)pvVar20 + (lVar29 * lVar30 + lVar21) * 8);
                            uVar7 = *(undefined8 *)((long)data_c + lVar33 * 8);
                            *(ulong *)((long)data_c + lVar33 * 8) =
                                 CONCAT44((float)((ulong)uVar7 >> 0x20) +
                                          fVar5 * fVar4 + fVar40 * fVar39,
                                          (float)uVar7 + fVar5 * fVar40 + -fVar4 * fVar39);
                            lVar32 = lVar32 + 1;
                          } while (iVar16 != lVar32);
                        }
                      }
                      else if (0 < iVar16) {
                        lVar32 = 0;
                        do {
                          lVar33 = (*(int *)((long)jptr_b + lVar32 * 4 + lVar22 * 4) - jlo_b) +
                                   local_178 * lVar21;
                          uVar7 = *(undefined8 *)((long)pvVar20 + (lVar29 + lVar21 * lVar30) * 8);
                          fVar39 = (float)uVar7;
                          fVar40 = (float)((ulong)uVar7 >> 0x20);
                          fVar4 = *(float *)((long)val_b + lVar32 * 8 + lVar22 * 8);
                          fVar5 = *(float *)((long)val_b + lVar32 * 8 + lVar22 * 8 + 4);
                          uVar7 = *(undefined8 *)((long)data_c + lVar33 * 8 + 8);
                          *(ulong *)((long)data_c + lVar33 * 8 + 8) =
                               CONCAT44((float)((ulong)uVar7 >> 0x20) +
                                        fVar4 * fVar40 + fVar39 * fVar5,
                                        (float)uVar7 + fVar4 * fVar39 + -fVar40 * fVar5);
                          lVar32 = lVar32 + 1;
                        } while (iVar16 != lVar32);
                      }
                      bVar38 = IVar24 != IVar27;
                      IVar24 = IVar24 + 1;
                    } while (bVar38);
                  }
                  bVar38 = local_1c8 != lVar28;
                  local_1c8 = local_1c8 + 1;
                  local_180 = lVar28;
                } while (bVar38);
              }
              break;
            case 0x3ef:
              lVar28 = local_1b8;
              local_168 = local_1a8;
              if (trans != 0) {
                lVar28 = local_1b0;
                local_168 = local_1a0;
              }
              if (local_168 <= lVar28) {
                local_158 = (local_1b8 - local_1a8) * 2 + 2;
                lVar30 = (local_1b8 - local_1a8) + 1;
                local_1c8 = local_168;
                do {
                  if (IVar15 <= IVar27) {
                    lVar21 = local_1c8 - local_168;
                    IVar24 = IVar15;
                    do {
                      lVar29 = IVar24 - IVar15;
                      iVar16 = *(int *)((long)iptr_b + lVar29 * 4);
                      lVar22 = (long)iVar16;
                      iVar16 = *(int *)((long)iptr_b + lVar29 * 4 + 4) - iVar16;
                      if (trans == 0) {
                        if (0 < iVar16) {
                          pdVar31 = (double *)((long)val_b + lVar22 * 0x10 + 8);
                          lVar32 = 0;
                          do {
                            dVar13 = *(double *)
                                      ((long)pvVar20 + (local_158 * lVar21 * lVar29 | 1U) * 8);
                            lVar33 = (((*(int *)((long)jptr_b + lVar32 * 4 + lVar22 * 4) - jlo_b) +
                                      1) * local_178 + lVar21) * 0x10;
                            dVar6 = *(double *)((long)pvVar20 + (lVar29 * lVar30 + lVar21) * 0x10);
                            pdVar1 = (double *)((long)data_c + lVar33);
                            dVar14 = pdVar1[1] + pdVar31[-1] * dVar13 + dVar6 * *pdVar31;
                            auVar10._8_4_ = SUB84(dVar14,0);
                            auVar10._0_8_ = *pdVar1 + pdVar31[-1] * dVar6 + -dVar13 * *pdVar31;
                            auVar10._12_4_ = (int)((ulong)dVar14 >> 0x20);
                            *(undefined1 (*) [16])((long)data_c + lVar33) = auVar10;
                            lVar32 = lVar32 + 1;
                            pdVar31 = pdVar31 + 2;
                          } while (iVar16 != lVar32);
                        }
                      }
                      else if (0 < iVar16) {
                        pdVar31 = (double *)((long)val_b + lVar22 * 0x10 + 8);
                        lVar32 = 0;
                        do {
                          lVar33 = ((*(int *)((long)jptr_b + lVar32 * 4 + lVar22 * 4) - jlo_b) +
                                   local_178 * lVar21) * 0x10;
                          pdVar1 = (double *)((long)pvVar20 + (lVar29 + lVar21 * lVar30) * 0x10);
                          dVar6 = *pdVar1;
                          dVar14 = pdVar1[1];
                          pdVar1 = (double *)(lVar33 + 0x10 + (long)data_c);
                          dVar13 = pdVar1[1] + pdVar31[-1] * dVar14 + dVar6 * *pdVar31;
                          auVar9._8_4_ = SUB84(dVar13,0);
                          auVar9._0_8_ = *pdVar1 + pdVar31[-1] * dVar6 + -dVar14 * *pdVar31;
                          auVar9._12_4_ = (int)((ulong)dVar13 >> 0x20);
                          *(undefined1 (*) [16])(lVar33 + 0x10 + (long)data_c) = auVar9;
                          lVar32 = lVar32 + 1;
                          pdVar31 = pdVar31 + 2;
                        } while (iVar16 != lVar32);
                      }
                      bVar38 = IVar24 != IVar27;
                      IVar24 = IVar24 + 1;
                    } while (bVar38);
                  }
                  bVar38 = local_1c8 != lVar28;
                  local_1c8 = local_1c8 + 1;
                  local_180 = lVar28;
                } while (bVar38);
              }
              break;
            case 0x3f8:
              lVar28 = local_1b8;
              lVar30 = local_1a8;
              if (trans != 0) {
                lVar28 = local_1b0;
                lVar30 = local_1a0;
              }
              if (lVar30 <= lVar28) {
                lVar21 = (local_1b8 - local_1a8) + 1;
                local_1e8 = lVar30;
                do {
                  if (IVar15 <= IVar27) {
                    lVar22 = local_1e8 - lVar30;
                    IVar24 = IVar15;
                    do {
                      lVar29 = IVar24 - IVar15;
                      iVar16 = *(int *)((long)iptr_b + lVar29 * 4);
                      lVar32 = (long)iVar16;
                      iVar16 = *(int *)((long)iptr_b + lVar29 * 4 + 4) - iVar16;
                      if (trans == 0) {
                        if (0 < iVar16) {
                          lVar33 = 0;
                          do {
                            plVar3 = (long *)((long)data_c +
                                             ((*(int *)((long)jptr_b + lVar33 * 4 + lVar32 * 4) -
                                              jlo_b) + 1) * local_178 * 8 + lVar22 * 8);
                            *plVar3 = *plVar3 + *(long *)((long)val_b + lVar33 * 8 + lVar32 * 8) *
                                                *(long *)((long)pvVar20 +
                                                         lVar29 * lVar21 * 8 + lVar22 * 8);
                            lVar33 = lVar33 + 1;
                          } while (iVar16 != lVar33);
                        }
                      }
                      else if (0 < iVar16) {
                        lVar33 = 0;
                        do {
                          plVar3 = (long *)((long)data_c +
                                           (*(int *)((long)jptr_b + lVar33 * 4 + lVar32 * 4) - jlo_b
                                           ) * 8 + local_178 * lVar22 * 8 + 8);
                          *plVar3 = *plVar3 + *(long *)((long)val_b + lVar33 * 8 + lVar32 * 8) *
                                              *(long *)((long)pvVar20 +
                                                       lVar29 * 8 + lVar22 * lVar21 * 8);
                          lVar33 = lVar33 + 1;
                        } while (iVar16 != lVar33);
                      }
                      bVar38 = IVar24 != IVar27;
                      IVar24 = IVar24 + 1;
                    } while (bVar38);
                  }
                  bVar38 = local_1e8 != lVar28;
                  local_1e8 = local_1e8 + 1;
                } while (bVar38);
              }
            }
          }
          else {
            switch(local_150) {
            case 0x3e9:
              lVar28 = local_1b8;
              lVar30 = local_1a8;
              if (trans != 0) {
                lVar28 = local_1b0;
                lVar30 = local_1a0;
              }
              if (lVar30 <= lVar28) {
                lVar22 = (local_1b8 - local_1a8) + 1;
                lVar21 = lVar30;
                do {
                  if (IVar15 <= IVar27) {
                    lVar29 = lVar21 - lVar30;
                    IVar24 = IVar15;
                    do {
                      lVar34 = IVar24 - IVar15;
                      lVar32 = *(long *)((long)iptr_b + lVar34 * 8);
                      lVar33 = *(long *)((long)iptr_b + lVar34 * 8 + 8);
                      if (trans == 0) {
                        if (lVar33 != lVar32 && -1 < lVar33 - lVar32) {
                          do {
                            piVar2 = (int *)((long)data_c +
                                            ((*(long *)((long)jptr_b + lVar32 * 8) - jlo_b) + 1) *
                                            local_178 * 4 + lVar29 * 4);
                            *piVar2 = *piVar2 + *(int *)((long)val_b + lVar32 * 4) *
                                                *(int *)((long)pvVar20 +
                                                        lVar34 * lVar22 * 4 + lVar29 * 4);
                            lVar32 = lVar32 + 1;
                          } while (lVar33 != lVar32);
                        }
                      }
                      else if (0 < lVar33 - lVar32) {
                        do {
                          piVar2 = (int *)((long)data_c +
                                          (*(long *)((long)jptr_b + lVar32 * 8) - jlo_b) * 4 +
                                          local_178 * lVar29 * 4 + 4);
                          *piVar2 = *piVar2 + *(int *)((long)val_b + lVar32 * 4) *
                                              *(int *)((long)pvVar20 +
                                                      lVar34 * 4 + lVar29 * lVar22 * 4);
                          lVar32 = lVar32 + 1;
                        } while (lVar33 != lVar32);
                      }
                      bVar38 = IVar24 != IVar27;
                      IVar24 = IVar24 + 1;
                    } while (bVar38);
                  }
                  bVar38 = lVar21 != lVar28;
                  lVar21 = lVar21 + 1;
                } while (bVar38);
              }
              break;
            case 0x3ea:
              lVar28 = local_1b8;
              lVar30 = local_1a8;
              if (trans != 0) {
                lVar28 = local_1b0;
                lVar30 = local_1a0;
              }
              if (lVar30 <= lVar28) {
                lVar21 = (local_1b8 - local_1a8) + 1;
                local_200 = lVar30;
                do {
                  if (IVar15 <= IVar27) {
                    lVar22 = local_200 - lVar30;
                    IVar24 = IVar15;
                    do {
                      lVar29 = IVar24 - IVar15;
                      lVar32 = *(long *)((long)iptr_b + lVar29 * 8 + 8) -
                               *(long *)((long)iptr_b + lVar29 * 8);
                      if (trans == 0) {
                        if (0 < lVar32) {
                          lVar33 = 0;
                          do {
                            lVar34 = *(long *)((long)iptr_b + lVar29 * 8) + lVar33;
                            plVar3 = (long *)((long)data_c +
                                             ((*(long *)((long)jptr_b + lVar34 * 8) - jlo_b) + 1) *
                                             local_178 * 8 + lVar22 * 8);
                            *plVar3 = *plVar3 + *(long *)((long)val_b + lVar34 * 8) *
                                                *(long *)((long)pvVar20 +
                                                         lVar29 * lVar21 * 8 + lVar22 * 8);
                            lVar33 = lVar33 + 1;
                          } while (lVar32 != lVar33);
                        }
                      }
                      else if (0 < lVar32) {
                        lVar33 = 0;
                        do {
                          lVar34 = *(long *)((long)iptr_b + lVar29 * 8) + lVar33;
                          plVar3 = (long *)((long)data_c +
                                           local_178 * lVar22 * 8 +
                                           (*(long *)((long)jptr_b + lVar34 * 8) - jlo_b) * 8 + 8);
                          *plVar3 = *plVar3 + *(long *)((long)val_b + lVar34 * 8) *
                                              *(long *)((long)pvVar20 +
                                                       lVar29 * 8 + lVar22 * lVar21 * 8);
                          lVar33 = lVar33 + 1;
                        } while (lVar32 != lVar33);
                      }
                      bVar38 = IVar24 != IVar27;
                      IVar24 = IVar24 + 1;
                    } while (bVar38);
                  }
                  bVar38 = local_200 != lVar28;
                  local_200 = local_200 + 1;
                } while (bVar38);
              }
              break;
            case 0x3eb:
              lVar28 = local_1b8;
              lVar30 = local_1a8;
              if (trans != 0) {
                lVar28 = local_1b0;
                lVar30 = local_1a0;
              }
              if (lVar30 <= lVar28) {
                lVar22 = (local_1b8 - local_1a8) + 1;
                lVar21 = lVar30;
                do {
                  if (IVar15 <= IVar27) {
                    lVar32 = lVar21 - lVar30;
                    lVar29 = local_178 * lVar32 * 4 + 4;
                    IVar24 = IVar15;
                    do {
                      lVar37 = IVar24 - IVar15;
                      lVar33 = *(long *)((long)iptr_b + lVar37 * 8);
                      lVar34 = *(long *)((long)iptr_b + lVar37 * 8 + 8);
                      if (trans == 0) {
                        if (lVar34 != lVar33 && -1 < lVar34 - lVar33) {
                          do {
                            lVar25 = ((*(long *)((long)jptr_b + lVar33 * 8) - jlo_b) + 1) *
                                     local_178;
                            *(float *)((long)data_c + lVar25 * 4 + lVar32 * 4) =
                                 *(float *)((long)pvVar20 + lVar37 * lVar22 * 4 + lVar32 * 4) *
                                 *(float *)((long)val_b + lVar33 * 4) +
                                 *(float *)((long)data_c + lVar25 * 4 + lVar32 * 4);
                            lVar33 = lVar33 + 1;
                          } while (lVar34 != lVar33);
                        }
                      }
                      else if (0 < lVar34 - lVar33) {
                        do {
                          lVar25 = *(long *)((long)jptr_b + lVar33 * 8) - jlo_b;
                          *(float *)((long)data_c + lVar25 * 4 + lVar29) =
                               *(float *)((long)pvVar20 + lVar37 * 4 + lVar32 * lVar22 * 4) *
                               *(float *)((long)val_b + lVar33 * 4) +
                               *(float *)((long)data_c + lVar25 * 4 + lVar29);
                          lVar33 = lVar33 + 1;
                        } while (lVar34 != lVar33);
                      }
                      bVar38 = IVar24 != IVar27;
                      IVar24 = IVar24 + 1;
                    } while (bVar38);
                  }
                  bVar38 = lVar21 != lVar28;
                  lVar21 = lVar21 + 1;
                } while (bVar38);
              }
              break;
            case 0x3ec:
              lVar28 = local_1b8;
              lVar30 = local_1a8;
              if (trans != 0) {
                lVar28 = local_1b0;
                lVar30 = local_1a0;
              }
              if (lVar30 <= lVar28) {
                lVar22 = (local_1b8 - local_1a8) + 1;
                lVar21 = lVar30;
                do {
                  if (IVar15 <= IVar27) {
                    lVar32 = lVar21 - lVar30;
                    lVar29 = local_178 * lVar32 * 8 + 8;
                    IVar24 = IVar15;
                    do {
                      lVar37 = IVar24 - IVar15;
                      lVar33 = *(long *)((long)iptr_b + lVar37 * 8);
                      lVar34 = *(long *)((long)iptr_b + lVar37 * 8 + 8);
                      if (trans == 0) {
                        if (lVar34 != lVar33 && -1 < lVar34 - lVar33) {
                          do {
                            lVar25 = ((*(long *)((long)jptr_b + lVar33 * 8) - jlo_b) + 1) *
                                     local_178;
                            *(double *)((long)data_c + lVar25 * 8 + lVar32 * 8) =
                                 *(double *)((long)pvVar20 + lVar37 * lVar22 * 8 + lVar32 * 8) *
                                 *(double *)((long)val_b + lVar33 * 8) +
                                 *(double *)((long)data_c + lVar25 * 8 + lVar32 * 8);
                            lVar33 = lVar33 + 1;
                          } while (lVar34 != lVar33);
                        }
                      }
                      else if (0 < lVar34 - lVar33) {
                        do {
                          lVar25 = *(long *)((long)jptr_b + lVar33 * 8) - jlo_b;
                          *(double *)((long)data_c + lVar25 * 8 + lVar29) =
                               *(double *)((long)pvVar20 + lVar37 * 8 + lVar32 * lVar22 * 8) *
                               *(double *)((long)val_b + lVar33 * 8) +
                               *(double *)((long)data_c + lVar25 * 8 + lVar29);
                          lVar33 = lVar33 + 1;
                        } while (lVar34 != lVar33);
                      }
                      bVar38 = IVar24 != IVar27;
                      IVar24 = IVar24 + 1;
                    } while (bVar38);
                  }
                  bVar38 = lVar21 != lVar28;
                  lVar21 = lVar21 + 1;
                } while (bVar38);
              }
              break;
            case 0x3ee:
              lVar28 = local_1b8;
              lVar30 = local_1a8;
              if (trans != 0) {
                lVar28 = local_1b0;
                lVar30 = local_1a0;
              }
              if (lVar30 <= lVar28) {
                local_180 = (local_1b8 - local_1a8) * 2 + 2;
                lVar21 = (local_1b8 - local_1a8) + 1;
                local_1e8 = lVar30;
                do {
                  if (IVar15 <= IVar27) {
                    lVar22 = local_1e8 - lVar30;
                    IVar24 = IVar15;
                    do {
                      lVar33 = IVar24 - IVar15;
                      lVar29 = *(long *)((long)iptr_b + lVar33 * 8);
                      lVar32 = *(long *)((long)iptr_b + lVar33 * 8 + 8);
                      if (trans == 0) {
                        if (lVar32 != lVar29 && -1 < lVar32 - lVar29) {
                          do {
                            fVar4 = *(float *)((long)pvVar20 +
                                              (local_180 * lVar22 * lVar33 | 1U) * 4);
                            lVar34 = ((*(long *)((long)jptr_b + lVar29 * 8) - jlo_b) + 1) *
                                     local_178 + lVar22;
                            fVar5 = *(float *)((long)val_b + lVar29 * 8);
                            fVar39 = *(float *)((long)val_b + lVar29 * 8 + 4);
                            fVar40 = *(float *)((long)pvVar20 + (lVar33 * lVar21 + lVar22) * 8);
                            uVar7 = *(undefined8 *)((long)data_c + lVar34 * 8);
                            *(ulong *)((long)data_c + lVar34 * 8) =
                                 CONCAT44((float)((ulong)uVar7 >> 0x20) +
                                          fVar5 * fVar4 + fVar40 * fVar39,
                                          (float)uVar7 + fVar5 * fVar40 + -fVar4 * fVar39);
                            lVar29 = lVar29 + 1;
                          } while (lVar32 != lVar29);
                        }
                      }
                      else if (0 < lVar32 - lVar29) {
                        do {
                          lVar34 = (*(long *)((long)jptr_b + lVar29 * 8) - jlo_b) +
                                   local_178 * lVar22;
                          uVar7 = *(undefined8 *)((long)pvVar20 + (lVar33 + lVar22 * lVar21) * 8);
                          fVar39 = (float)uVar7;
                          fVar40 = (float)((ulong)uVar7 >> 0x20);
                          fVar4 = *(float *)((long)val_b + lVar29 * 8);
                          fVar5 = *(float *)((long)val_b + lVar29 * 8 + 4);
                          uVar7 = *(undefined8 *)((long)data_c + lVar34 * 8 + 8);
                          *(ulong *)((long)data_c + lVar34 * 8 + 8) =
                               CONCAT44((float)((ulong)uVar7 >> 0x20) +
                                        fVar4 * fVar40 + fVar39 * fVar5,
                                        (float)uVar7 + fVar4 * fVar39 + -fVar40 * fVar5);
                          lVar29 = lVar29 + 1;
                        } while (lVar32 != lVar29);
                      }
                      bVar38 = IVar24 != IVar27;
                      IVar24 = IVar24 + 1;
                    } while (bVar38);
                  }
                  bVar38 = local_1e8 != lVar28;
                  local_1e8 = local_1e8 + 1;
                } while (bVar38);
              }
              break;
            case 0x3ef:
              lVar28 = local_1b8;
              local_180 = local_1a8;
              if (trans != 0) {
                lVar28 = local_1b0;
                local_180 = local_1a0;
              }
              if (local_180 <= lVar28) {
                local_168 = (local_1b8 - local_1a8) * 2 + 2;
                lVar30 = (local_1b8 - local_1a8) + 1;
                local_1d8 = local_180;
                do {
                  if (IVar15 <= IVar27) {
                    lVar21 = local_1d8 - local_180;
                    IVar24 = IVar15;
                    do {
                      lVar32 = IVar24 - IVar15;
                      lVar22 = *(long *)((long)iptr_b + lVar32 * 8);
                      lVar29 = *(long *)((long)iptr_b + lVar32 * 8 + 8);
                      if (trans == 0) {
                        if (lVar29 != lVar22 && -1 < lVar29 - lVar22) {
                          pdVar31 = (double *)((long)val_b + lVar22 * 0x10 + 8);
                          do {
                            dVar13 = *(double *)
                                      ((long)pvVar20 + (local_168 * lVar21 * lVar32 | 1U) * 8);
                            lVar33 = (((*(long *)((long)jptr_b + lVar22 * 8) - jlo_b) + 1) *
                                      local_178 + lVar21) * 0x10;
                            dVar6 = *(double *)((long)pvVar20 + (lVar32 * lVar30 + lVar21) * 0x10);
                            pdVar1 = (double *)((long)data_c + lVar33);
                            dVar14 = pdVar1[1] + pdVar31[-1] * dVar13 + dVar6 * *pdVar31;
                            auVar12._8_4_ = SUB84(dVar14,0);
                            auVar12._0_8_ = *pdVar1 + pdVar31[-1] * dVar6 + -dVar13 * *pdVar31;
                            auVar12._12_4_ = (int)((ulong)dVar14 >> 0x20);
                            *(undefined1 (*) [16])((long)data_c + lVar33) = auVar12;
                            lVar22 = lVar22 + 1;
                            pdVar31 = pdVar31 + 2;
                          } while (lVar29 != lVar22);
                        }
                      }
                      else if (0 < lVar29 - lVar22) {
                        pdVar31 = (double *)((long)val_b + lVar22 * 0x10 + 8);
                        do {
                          lVar33 = ((*(long *)((long)jptr_b + lVar22 * 8) - jlo_b) +
                                   local_178 * lVar21) * 0x10;
                          pdVar1 = (double *)((long)pvVar20 + (lVar32 + lVar21 * lVar30) * 0x10);
                          dVar6 = *pdVar1;
                          dVar14 = pdVar1[1];
                          pdVar1 = (double *)(lVar33 + 0x10 + (long)data_c);
                          dVar13 = pdVar1[1] + pdVar31[-1] * dVar14 + dVar6 * *pdVar31;
                          auVar11._8_4_ = SUB84(dVar13,0);
                          auVar11._0_8_ = *pdVar1 + pdVar31[-1] * dVar6 + -dVar14 * *pdVar31;
                          auVar11._12_4_ = (int)((ulong)dVar13 >> 0x20);
                          *(undefined1 (*) [16])(lVar33 + 0x10 + (long)data_c) = auVar11;
                          lVar22 = lVar22 + 1;
                          pdVar31 = pdVar31 + 2;
                        } while (lVar29 != lVar22);
                      }
                      bVar38 = IVar24 != IVar27;
                      IVar24 = IVar24 + 1;
                    } while (bVar38);
                  }
                  bVar38 = local_1d8 != lVar28;
                  local_1d8 = local_1d8 + 1;
                } while (bVar38);
              }
              break;
            case 0x3f8:
              lVar28 = local_1b8;
              lVar30 = local_1a8;
              if (trans != 0) {
                lVar28 = local_1b0;
                lVar30 = local_1a0;
              }
              if (lVar30 <= lVar28) {
                lVar22 = (local_1b8 - local_1a8) + 1;
                lVar21 = lVar30;
                do {
                  if (IVar15 <= IVar27) {
                    lVar29 = lVar21 - lVar30;
                    IVar24 = IVar15;
                    do {
                      lVar34 = IVar24 - IVar15;
                      lVar32 = *(long *)((long)iptr_b + lVar34 * 8);
                      lVar33 = *(long *)((long)iptr_b + lVar34 * 8 + 8);
                      if (trans == 0) {
                        if (lVar33 != lVar32 && -1 < lVar33 - lVar32) {
                          do {
                            plVar3 = (long *)((long)data_c +
                                             ((*(long *)((long)jptr_b + lVar32 * 8) - jlo_b) + 1) *
                                             local_178 * 8 + lVar29 * 8);
                            *plVar3 = *plVar3 + *(long *)((long)val_b + lVar32 * 8) *
                                                *(long *)((long)pvVar20 +
                                                         lVar34 * lVar22 * 8 + lVar29 * 8);
                            lVar32 = lVar32 + 1;
                          } while (lVar33 != lVar32);
                        }
                      }
                      else if (0 < lVar33 - lVar32) {
                        do {
                          plVar3 = (long *)((long)data_c +
                                           (*(long *)((long)jptr_b + lVar32 * 8) - jlo_b) * 8 +
                                           local_178 * lVar29 * 8 + 8);
                          *plVar3 = *plVar3 + *(long *)((long)val_b + lVar32 * 8) *
                                              *(long *)((long)pvVar20 +
                                                       lVar34 * 8 + lVar29 * lVar22 * 8);
                          lVar32 = lVar32 + 1;
                        } while (lVar33 != lVar32);
                      }
                      bVar38 = IVar24 != IVar27;
                      IVar24 = IVar24 + 1;
                    } while (bVar38);
                  }
                  bVar38 = lVar21 != lVar28;
                  lVar21 = lVar21 + 1;
                } while (bVar38);
              }
            }
          }
          free(pvVar20);
          lVar28 = local_160;
          lVar30 = local_148;
        }
        IVar36 = IVar36 + 1;
      } while (IVar36 != lVar28);
      IVar18 = IVar18 + 1;
    } while (IVar18 != lVar28);
  }
  if (local_12c != 0) {
    pnga_pgroup_sync(*(Integer *)((long)&SPA->grp + lVar30));
  }
  return g_a_00;
}

Assistant:

Integer pnga_sprs_array_dnssprs_multiply(Integer g_a, Integer s_b, Integer trans)
{
  Integer lcnt;
  Integer icnt;
  Integer hdl_a = g_a+GA_OFFSET;
  Integer hdl_b = s_b+GA_OFFSET;
  Integer hdl_c;
  int local_sync_begin,local_sync_end;
  Integer elemsize;
  Integer idim, jdim;
  Integer i, j, k, l, m, n, nn;
  Integer nprocs = pnga_pgroup_nnodes(SPA[hdl_b].grp);
  Integer me = pnga_pgroup_nodeid(SPA[hdl_b].grp);
  Integer longidx;
  Integer type;
  Integer ihi, ilo, jhi, jlo;
  Integer gdims[2], blocks[2];
  Integer rowdim;
  Integer *count;
  Integer nblocks;
  Integer g_c;
  Integer two = 2;
  Integer ilen;
  Integer max_nnz_a, max_nnz_b;
  Integer *row_nnz;
  int64_t max_nnz;
  Integer *map, *size;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if (local_sync_begin) pnga_pgroup_sync(SPA[hdl_b].grp);

  /* Do some initial verification to see if matrix multiply is possible */
  if (GA[hdl_a].type != SPA[hdl_b].type) {
    pnga_error("(ga_sprs_array_dnssprs_multiply) types of sparse matrices"
    " A and B must match",0);
  }
  type = SPA[hdl_b].type;
  if (GA[hdl_a].p_handle != SPA[hdl_b].grp) {
    pnga_error("(ga_sprs_array_dnssprs_multiply) matrices A and B must"
    " be on the same group",0);
  }
  if (GA[hdl_a].ndim != 2) {
    pnga_error("(ga_sprs_array_dnssprs_multiply) matrix A must be"
    " of dimension 2",GA[hdl_a].ndim);
  }
  if ((trans && GA[hdl_a].dims[0] != SPA[hdl_b].jdim) ||
      (!trans && GA[hdl_a].dims[1] != SPA[hdl_b].jdim)) {
    pnga_error("(ga_sprs_array_dnssprs_multiply) column dimension of"
      " A must match row dimension of B",0);
  }
  if (SPA[hdl_b].idx_size == sizeof(int64_t)) {
    longidx = 1;
  } else {
    longidx = 0;
  }
  elemsize = SPA[hdl_b].size;
  if (trans) {
    idim = GA[hdl_a].dims[1];
  } else {
    idim = GA[hdl_a].dims[0];
  }
  jdim = SPA[hdl_b].jdim;
  /* Construct product array C*/
  g_c = pnga_create_handle();
  hdl_c = g_c + GA_OFFSET;
  if (trans) {
    gdims[0] = jdim;
    gdims[1] = idim;
  } else {
    gdims[0] = idim;
    gdims[1] = jdim;
  }
  pnga_set_data(g_c,two,gdims,type);
  map = (Integer*)malloc((nprocs+1)*sizeof(Integer));
  size = (Integer*)malloc(nprocs*sizeof(Integer));
  /* Create a partition for dense C matrix */
  ilo = (idim*me)/nprocs;
  while ((ilo*nprocs)/idim < me) {
    ilo++;
  }
  while ((ilo*nprocs)/idim > me) {
    ilo--;
  }
  if ((ilo*nprocs)/idim != me) {
    ilo++;
  }
  ilo++;
  if (me < nprocs-1) {
    ihi = (idim*(me+1))/nprocs;
    while ((ihi*nprocs)/idim < me+1) {
      ihi++;
    }
    while ((ihi*nprocs)/idim > me+1) {
      ihi--;
    }
    ihi--;
  } else {
    ihi = idim-1;
  }
  ihi++;

  for (i=0; i<nprocs; i++) size[i] = 0;
  size[me] = ihi-ilo+1;
  if (sizeof(Integer) == 8) {
    pnga_pgroup_gop(SPA[hdl_b].grp,C_LONG,size,nprocs,"+");
  } else {
    pnga_pgroup_gop(SPA[hdl_b].grp,C_INT,size,nprocs,"+");
  }
  if (trans) {
    map[0] = 1;
    map[1] = 1;
    for (i=1; i<nprocs; i++) {
      map[i+1] = map[i] + size[i-1];
    }
    blocks[0] = 1;
    blocks[1] = nprocs;
  } else {
    map[0] = 1;
    for (i=1; i<nprocs; i++) {
      map[i] = map[i-1] + size[i-1];
    }
    map[nprocs] = 1;
    blocks[0] = nprocs;
    blocks[1] = 1;
  }
  pnga_set_irreg_distr(g_c,map,blocks);
  pnga_set_pgroup(g_c,SPA[hdl_b].grp);
  if (!pnga_allocate(g_c)) {
    pnga_error("(ga_sprs_array_sprsdns_multiply) could not allocate"
      " product array C",0);
  }
  pnga_zero(g_c);
  /* loop over processors in row to get target block and then loop over
   * processors to get all block pairs that contribute to target block.
   * Multiply block pairs */
  for (l=0; l<nprocs; l++) {
    /* Find bounding dimensions (unit-based) of target block in row */
    void *data_c;
    void *data_a, *data_b, *iptr, *jptr;
    Integer lo_c[2], hi_c[2], ld_c[2];
    Integer tlo_c[2], thi_c[2];
    lo_c[0] = ilo;
    hi_c[0] = ihi;
    pnga_sprs_array_row_distribution(s_b,l,&lo_c[1],&hi_c[1]);
    lo_c[1]++;
    hi_c[1]++;
    if (trans) {
      tlo_c[0] = lo_c[1];
      thi_c[0] = hi_c[1];
      tlo_c[1] = lo_c[0];
      thi_c[1] = hi_c[0];
    } else {
      tlo_c[0] = lo_c[0];
      thi_c[0] = hi_c[0];
      tlo_c[1] = lo_c[1];
      thi_c[1] = hi_c[1];
    }
    /* loop over all sub-blocks in row block of A and column block of B
     * that contribute to target block */
    for (n=0; n<nprocs; n++) {
      void *iptr_b, *jptr_b;
      Integer lo_a[2], hi_a[2], ld_a[2];
      Integer tlo_a[2], thi_a[2];
      Integer ilo_b, ihi_b, jlo_b, jhi_b;
      void *buf_a;
      void *val_b;
      Integer nelem;
      Integer ii,jlen;
      /* calculate values of jlo and jhi for block in g_b */
      if (trans) {
        ld_c[0] = jdim;
        ld_c[1] = thi_c[1]-tlo_c[1]+1;
      } else {
        ld_c[0] = thi_c[0]-tlo_c[0]+1;
        ld_c[1] = jdim;
      }
      pnga_access_ptr(g_c,tlo_c,thi_c,&data_c,ld_c);
      /* Get block of B for multiplication */
      if (!pnga_sprs_array_get_block(s_b,n,l,&iptr_b,&jptr_b,&val_b,
            &ilo_b,&ihi_b,&jlo_b,&jhi_b)) continue;
      /* get pointers to dense blocks on A and C */
      lo_a[0] = lo_c[0];
      hi_a[0] = hi_c[0];
      lo_a[1] = ilo_b;
      hi_a[1] = ihi_b;
      if (trans) {
        tlo_a[0] = lo_a[1];
        thi_a[0] = hi_a[1];
        tlo_a[1] = lo_a[0];
        thi_a[1] = hi_a[0];
      } else {
        tlo_a[0] = lo_a[0];
        thi_a[0] = hi_a[0];
        tlo_a[1] = lo_a[1];
        thi_a[1] = hi_a[1];
      }
      /* Copy block from dense array into buffer */
      nelem = (thi_a[0]-tlo_a[0]+1)*(thi_a[1]-tlo_a[1]+1);
      buf_a = malloc(nelem*SPA[hdl_b].size);
      ld_a[0] = (thi_a[0]-tlo_a[0]+1);
      ld_a[1] = (thi_a[1]-tlo_a[1]+1);
      pnga_get(g_a,tlo_a,thi_a,buf_a,ld_a);
      if (SPA[hdl_b].idx_size == 4) {
        int *idx_b = (int*)iptr_b;
        int *jdx_b = (int*)jptr_b;
        data_b = val_b;

        /* now have access to blocks from A, B, and C. Perform block
         * multiplication */
        if (type == C_INT) {
          REAL_DNSSPRS_MULTIPLY_M(int,tlo_a,thi_a,ilo_b,ihi_b,jlo_b,jhi_b,
              idx_b,jdx_b,buf_a,data_b,data_c,ld_c[0]);
        } else if (type == C_LONG) {
          REAL_DNSSPRS_MULTIPLY_M(long,tlo_a,thi_a,ilo_b,ihi_b,jlo_b,jhi_b,
              idx_b,jdx_b,buf_a,data_b,data_c,ld_c[0]);
        } else if (type == C_LONGLONG) {
          REAL_DNSSPRS_MULTIPLY_M(long long,tlo_a,thi_a,ilo_b,ihi_b,
              jlo_b,jhi_b,idx_b,jdx_b,buf_a,data_b,data_c,ld_c[0]);
        } else if (type == C_FLOAT) {
          REAL_DNSSPRS_MULTIPLY_M(float,tlo_a,thi_a,ilo_b,ihi_b,jlo_b,jhi_b,
              idx_b,jdx_b,buf_a,data_b,data_c,ld_c[0]);
        } else if (type == C_DBL) {
          REAL_DNSSPRS_MULTIPLY_M(double,tlo_a,thi_a,ilo_b,ihi_b,jlo_b,jhi_b,
              idx_b,jdx_b,buf_a,data_b,data_c,ld_c[0]);
        } else if (type == C_SCPL) {
          COMPLEX_DNSSPRS_MULTIPLY_M(float,tlo_a,thi_a,ilo_b,ihi_b,jlo_b,
              jhi_b,idx_b,jdx_b,buf_a,data_b,data_c,ld_c[0]);
        } else if (type == C_DCPL) {
          COMPLEX_DNSSPRS_MULTIPLY_M(double,tlo_a,thi_a,ilo_b,ihi_b,jlo_b,
              jhi_b,idx_b,jdx_b,buf_a,data_b,data_c,ld_c[0]);
        }
      } else {
        int64_t *idx_b = (int64_t*)iptr_b;
        int64_t *jdx_b = (int64_t*)jptr_b;
        data_b = val_b;
        /* now have access to blocks from A, B, and C. Perform block
         * multiplication */
        if (type == C_INT) {
          REAL_DNSSPRS_MULTIPLY_M(int,tlo_a,thi_a,ilo_b,ihi_b,jlo_b,jhi_b,
              idx_b,jdx_b,buf_a,data_b,data_c,ld_c[0]);
        } else if (type == C_LONG) {
          REAL_DNSSPRS_MULTIPLY_M(long,tlo_a,thi_a,ilo_b,ihi_b,jlo_b,jhi_b,
              idx_b,jdx_b,buf_a,data_b,data_c,ld_c[0]);
        } else if (type == C_LONGLONG) {
          REAL_DNSSPRS_MULTIPLY_M(long long,tlo_a,thi_a,ilo_b,ihi_b,jlo_b,
              jhi_b,idx_b,jdx_b,buf_a,data_b,data_c,ld_c[0]);
        } else if (type == C_FLOAT) {
          REAL_DNSSPRS_MULTIPLY_M(float,tlo_a,thi_a,ilo_b,ihi_b,jlo_b,jhi_b,
              idx_b,jdx_b,buf_a,data_b,data_c,ld_c[0]);
        } else if (type == C_DBL) {
          REAL_DNSSPRS_MULTIPLY_M(double,tlo_a,thi_a,ilo_b,ihi_b,jlo_b,jhi_b,
              idx_b,jdx_b,buf_a,data_b,data_c,ld_c[0]);
        } else if (type == C_SCPL) {
          COMPLEX_DNSSPRS_MULTIPLY_M(float,tlo_a,thi_a,ilo_b,ihi_b,jlo_b,
              jhi_b,idx_b,jdx_b,buf_a,data_b,data_c,ld_c[0]);
        } else if (type == C_DCPL) {
          COMPLEX_DNSSPRS_MULTIPLY_M(double,tlo_a,thi_a,ilo_b,ihi_b,jlo_b,
              jhi_b,idx_b,jdx_b,buf_a,data_b,data_c,ld_c[0]);
        }
      }
      free(buf_a);
    }
  }
  if (local_sync_end) pnga_pgroup_sync(SPA[hdl_b].grp);
  return g_c;
}